

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  socklen_t local_40;
  int local_3c;
  socklen_t errlen;
  int err;
  int i;
  pollfd pf;
  int pollret;
  rpchook_t *lp;
  int ret;
  socklen_t address_len_local;
  sockaddr *address_local;
  int fd_local;
  
  if (g_sys_connect_func == (connect_pfn_t)0x0) {
    g_sys_connect_func = (connect_pfn_t)dlsym(0xffffffffffffffff,"connect");
  }
  bVar2 = co_is_enable_sys_hook();
  if (bVar2) {
    address_local._4_4_ = (*g_sys_connect_func)(__fd,(sockaddr *)__addr,__len);
    register0x00000000 = get_by_fd(__fd);
    if (register0x00000000 != (rpchook_t *)0x0) {
      if (__len < 0x11) {
        memcpy(&register0x00000000->dest,__addr,(long)(int)__len);
      }
      if ((((stack0xffffffffffffffd8->user_flag & 0x800U) == 0) && (address_local._4_4_ < 0)) &&
         (piVar3 = __errno_location(), *piVar3 == 0x73)) {
        pf.fd = 0;
        memset(&err,0,8);
        for (errlen = 0; (int)errlen < 3; errlen = errlen + 1) {
          memset(&err,0,8);
          i._0_2_ = 0x1c;
          err = __fd;
          pf.fd = poll((pollfd *)&err,1,25000);
          if (pf.fd == 1) break;
        }
        if ((i._2_2_ & 4) == 0) {
          piVar3 = __errno_location();
          *piVar3 = 0x6e;
        }
        else {
          local_3c = 0;
          local_40 = 4;
          address_local._4_4_ = getsockopt(__fd,1,4,&local_3c,&local_40);
          iVar1 = local_3c;
          if (-1 < address_local._4_4_) {
            if (local_3c == 0) {
              piVar3 = __errno_location();
              *piVar3 = 0;
              address_local._4_4_ = 0;
            }
            else {
              piVar3 = __errno_location();
              *piVar3 = iVar1;
              address_local._4_4_ = -1;
            }
          }
        }
      }
    }
  }
  else {
    address_local._4_4_ = (*g_sys_connect_func)(__fd,(sockaddr *)__addr,__len);
  }
  return address_local._4_4_;
}

Assistant:

int connect(int fd, const struct sockaddr *address, socklen_t address_len)
{
	HOOK_SYS_FUNC( connect );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_connect_func(fd,address,address_len);
	}

	//1.sys call
	int ret = g_sys_connect_func( fd,address,address_len );

	rpchook_t *lp = get_by_fd( fd );
	if( !lp ) return ret;

	if( sizeof(lp->dest) >= address_len )
	{
		 memcpy( &(lp->dest),address,(int)address_len );
	}
	if( O_NONBLOCK & lp->user_flag ) 
	{
		return ret;
	}
	
	if (!(ret < 0 && errno == EINPROGRESS))
	{
		return ret;
	}

	//2.wait
	int pollret = 0;
	struct pollfd pf = { 0 };

	for(int i=0;i<3;i++) //25s * 3 = 75s
	{
		memset( &pf,0,sizeof(pf) );
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );

		pollret = poll( &pf,1,25000 );

		if( 1 == pollret  )
		{
			break;
		}
	}

	if( pf.revents & POLLOUT ) //connect succ
	{
    // 3.check getsockopt ret
    int err = 0;
    socklen_t errlen = sizeof(err);
    ret = getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen);
    if (ret < 0) {
      return ret;
    } else if (err != 0) {
      errno = err;
      return -1;
    }
    errno = 0;
    return 0;
  }

  errno = ETIMEDOUT;
	return ret;
}